

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch.c
# Opt level: O1

void find_best_pitch(opus_val32 *xcorr,opus_val16 *y,int len,int max_pitch,int *best_pitch)

{
  ulong uVar1;
  int *piVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  best_pitch[0] = 0;
  best_pitch[1] = 1;
  if (len < 1) {
    fVar3 = 1.0;
  }
  else {
    fVar3 = 1.0;
    uVar1 = 0;
    do {
      fVar3 = fVar3 + y[uVar1] * y[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)len != uVar1);
  }
  if (0 < max_pitch) {
    uVar1 = 0;
    fVar9 = 0.0;
    fVar8 = -1.0;
    fVar4 = -1.0;
    fVar6 = 0.0;
    do {
      fVar5 = fVar4;
      fVar7 = fVar6;
      if ((0.0 < (float)xcorr[uVar1]) &&
         (fVar10 = (float)xcorr[uVar1] * 1e-12, fVar10 = fVar10 * fVar10,
         fVar3 * fVar8 < fVar9 * fVar10)) {
        piVar2 = best_pitch + 1;
        fVar9 = fVar3;
        if (fVar3 * fVar4 < fVar6 * fVar10) {
          best_pitch[1] = *best_pitch;
          piVar2 = best_pitch;
          fVar5 = fVar10;
          fVar7 = fVar3;
          fVar10 = fVar4;
          fVar9 = fVar6;
        }
        *piVar2 = (int)uVar1;
        fVar8 = fVar10;
      }
      fVar4 = fVar3 + (y[(long)len + uVar1] * y[(long)len + uVar1] - y[uVar1] * y[uVar1]);
      fVar3 = 1.0;
      if (1.0 <= fVar4) {
        fVar3 = fVar4;
      }
      uVar1 = uVar1 + 1;
      fVar4 = fVar5;
      fVar6 = fVar7;
    } while ((uint)max_pitch != uVar1);
  }
  return;
}

Assistant:

static void find_best_pitch(opus_val32 *xcorr, opus_val16 *y, int len,
                            int max_pitch, int *best_pitch
#ifdef FIXED_POINT
        , int yshift, opus_val32 maxcorr
#endif
) {
    int i, j;
    opus_val32 Syy = 1;
    opus_val16 best_num[2];
    opus_val32 best_den[2];
#ifdef FIXED_POINT
    int xshift;

    xshift = celt_ilog2(maxcorr)-14;
#endif

    best_num[0] = -1;
    best_num[1] = -1;
    best_den[0] = 0;
    best_den[1] = 0;
    best_pitch[0] = 0;
    best_pitch[1] = 1;
    for (j = 0; j < len; j++)
        Syy = ADD32(Syy, SHR32(MULT16_16(y[j], y[j]), yshift));
    for (i = 0; i < max_pitch; i++) {
        if (xcorr[i] > 0) {
            opus_val16 num;
            opus_val32 xcorr16;
            xcorr16 = EXTRACT16(VSHR32(xcorr[i], xshift));
#ifndef FIXED_POINT
            /* Considering the range of xcorr16, this should avoid both underflows
               and overflows (inf) when squaring xcorr16 */
            xcorr16 *= 1e-12f;
#endif
            num = MULT16_16_Q15(xcorr16, xcorr16);
            if (MULT16_32_Q15(num, best_den[1]) > MULT16_32_Q15(best_num[1], Syy)) {
                if (MULT16_32_Q15(num, best_den[0]) > MULT16_32_Q15(best_num[0], Syy)) {
                    best_num[1] = best_num[0];
                    best_den[1] = best_den[0];
                    best_pitch[1] = best_pitch[0];
                    best_num[0] = num;
                    best_den[0] = Syy;
                    best_pitch[0] = i;
                } else {
                    best_num[1] = num;
                    best_den[1] = Syy;
                    best_pitch[1] = i;
                }
            }
        }
        Syy += SHR32(MULT16_16(y[i + len], y[i + len]), yshift) - SHR32(MULT16_16(y[i], y[i]), yshift);
        Syy = MAX32(1, Syy);
    }
}